

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

VRDatumPtr MinVR::CreateVRDatumFloat(void *pData)

{
  VRDatumPtrRC *extraout_RDX;
  VRDatum_conflict *in_RDI;
  VRDatumPtr VVar1;
  VRDatumFloat *obj;
  VRFloat in_stack_ffffffffffffffbc;
  VRDatum_conflict *this;
  VRDatum *in_stack_ffffffffffffffd8;
  VRDatumPtr *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  operator_new(0x68);
  VRDatumFloat::VRDatumFloat((VRDatumFloat *)this,in_stack_ffffffffffffffbc);
  VRDatumPtr::VRDatumPtr(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  VVar1.reference = extraout_RDX;
  VVar1.pData = in_RDI;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumFloat(void *pData) {
  VRDatumFloat *obj = new VRDatumFloat(*static_cast<VRFloat *>(pData));
  return VRDatumPtr(obj);
}